

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O2

void pztopology::TPZTetrahedron::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_c8;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  local_a8;
  Fad<double> zeta;
  Fad<double> eta;
  Fad<double> qsi;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  local_38;
  
  Fad<double>::Fad(&qsi,loc->fStore);
  Fad<double>::Fad(&eta,loc->fStore + 1);
  Fad<double>::Fad(&zeta,loc->fStore + 2);
  local_c8.fadexpr_.left_.constant_ = 1.0;
  local_c8.fadexpr_.left_.defaultVal = 0.0;
  local_a8.fadexpr_.left_ = &local_38;
  local_c8.fadexpr_.right_ = &qsi;
  local_a8.fadexpr_.right_ = &zeta;
  local_38.fadexpr_.left_ = &local_c8;
  local_38.fadexpr_.right_ = &eta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0,0);
  Fad<double>::operator=(pFVar1,&local_a8);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,1,0);
  Fad<double>::operator=(pFVar1,&qsi);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,2,0);
  Fad<double>::operator=(pFVar1,&eta);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,3,0);
  Fad<double>::operator=(pFVar1,&zeta);
  local_c8._0_8_ = 0xbff0000000000000;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0xbff0000000000000;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,0);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0xbff0000000000000;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,0);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0x3ff0000000000000;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,1);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,1);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,1);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,2);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0x3ff0000000000000;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,2);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,2);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,3);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,3);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  local_c8._0_8_ = 0x3ff0000000000000;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,3);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_c8);
  Vector<double>::destroy(&zeta.dx_);
  Vector<double>::destroy(&eta.dx_);
  Vector<double>::destroy(&qsi.dx_);
  return;
}

Assistant:

inline void TPZTetrahedron::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T qsi = loc[0], eta = loc[1] , zeta  = loc[2];

        phi(0,0)  = 1.0-qsi-eta-zeta;
        phi(1,0)  = qsi;
        phi(2,0)  = eta;
        phi(3,0)  = zeta;

        dphi(0,0) = -1.0;
        dphi(1,0) = -1.0;
        dphi(2,0) = -1.0;
        dphi(0,1) =  1.0;
        dphi(1,1) =  0.0;
        dphi(2,1) =  0.0;
        dphi(0,2) =  0.0;
        dphi(1,2) =  1.0;
        dphi(2,2) =  0.0;
        dphi(0,3) =  0.0;
        dphi(1,3) =  0.0;
        dphi(2,3) =  1.0;

    }